

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_renameFile(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t file_type;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  int *in_RCX;
  vm_val_t *in_RDX;
  err_frame_t err_cur__;
  CVmNetFile *newfile;
  CVmNetFile *oldfile;
  vm_rcdesc rc;
  uint argc;
  char *in_stack_00000f70;
  os_filetype_t in_stack_00000f7c;
  int in_stack_00000f80;
  int in_stack_00000f84;
  vm_rcdesc *in_stack_00000f88;
  vm_val_t *in_stack_00000f90;
  CVmNetFile *in_stack_fffffffffffffe68;
  CVmNetFile *in_stack_fffffffffffffe70;
  void *pvVar5;
  vm_val_t *in_stack_fffffffffffffe78;
  undefined8 uVar6;
  undefined4 in_stack_fffffffffffffe80;
  int access;
  uint in_stack_fffffffffffffe8c;
  void *local_168;
  __jmp_buf_tag _Stack_160;
  CVmNetFile *local_98;
  CVmNetFile *local_90;
  int local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (int *)0x0) {
    access = 0;
  }
  else {
    access = *in_RCX;
  }
  local_2c = access;
  local_20 = in_RDX;
  if ((getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_renameFile::desc,1);
    __cxa_guard_release(&getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    file_type = CVmMetaclass::get_class_obj
                          ((CVmMetaclass *)CONCAT44(access,in_stack_fffffffffffffe80));
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(access,file_type),(char *)in_stack_fffffffffffffe78,
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (unsigned_short)((ulong)in_stack_fffffffffffffe70 >> 0x10),
               (vm_val_t *)in_stack_fffffffffffffe68,0);
    local_90 = (CVmNetFile *)0x0;
    local_98 = (CVmNetFile *)0x0;
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    uVar6 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)&stack0xfffffffffffffe88;
    uVar2 = _setjmp(&_Stack_160);
    if (uVar2 == 0) {
      local_90 = CVmObjFile::get_filename_from_obj
                           ((vm_obj_id_t)((ulong)uVar6 >> 0x20),
                            (vm_rcdesc *)((ulong)in_stack_fffffffffffffe8c << 0x20),access,file_type
                            ,(char *)in_stack_fffffffffffffe78);
      CVmStack::get(0);
      local_98 = CVmObjFile::get_filename_arg
                           (in_stack_00000f90,in_stack_00000f88,in_stack_00000f84,in_stack_00000f80,
                            in_stack_00000f7c,in_stack_00000f70);
      CVmNetFile::rename_to(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    if ((uVar2 & 0x8000) == 0) {
      if (local_90 != (CVmNetFile *)0x0) {
        CVmNetFile::abandon(in_stack_fffffffffffffe70);
      }
      if (local_98 != (CVmNetFile *)0x0) {
        CVmNetFile::abandon(in_stack_fffffffffffffe70);
      }
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar6;
    if ((uVar2 & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar5 = local_168;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar5;
      err_rethrow();
    }
    if ((uVar2 & 2) != 0) {
      free(local_168);
    }
    vm_val_t::set_nil(local_20);
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_renameFile(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up our recursive callback descriptor in case netfile needs it */
    vm_rcdesc rc(vmg_ "FileName.renameFile",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_RENAMEFILE, G_stk->get(0), argc);

    CVmNetFile *oldfile = 0, *newfile = 0;
    err_try
    {
        /* get the old filename from self; use the RENAME FROM access mode */
        oldfile = CVmObjFile::get_filename_from_obj(
            vmg_ self, &rc, VMOBJFILE_ACCESS_RENAME_FROM,
            OSFTUNK, "application/octet-stream");
        
        /* get the new filename argument; use RENAME TO access mode */
        newfile = CVmObjFile::get_filename_arg(
            vmg_ G_stk->get(0), &rc, VMOBJFILE_ACCESS_RENAME_TO, FALSE,
            OSFTUNK, "application/octet-stream");

        /* rename the file */
        oldfile->rename_to(vmg_ newfile);
    }